

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O2

int __thiscall smf::Options::getInt(Options *this,string *optionName)

{
  long lVar1;
  string local_30;
  
  getString(&local_30,this,optionName);
  lVar1 = strtol(local_30._M_dataplus._M_p,(char **)0x0,0);
  std::__cxx11::string::~string((string *)&local_30);
  return (int)lVar1;
}

Assistant:

int Options::getInt(const std::string& optionName) {
	return (int)strtol(getString(optionName).c_str(), (char**)NULL, 0);
}